

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O1

EdgeIter __thiscall CMU462::HalfedgeMesh::flipEdge(HalfedgeMesh *this,EdgeIter e0)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  
  p_Var1 = e0._M_node[6]._M_prev;
  p_Var2 = p_Var1[1]._M_prev;
  p_Var3 = p_Var1[2]._M_next;
  p_Var4 = p_Var3[2]._M_next;
  p_Var5 = p_Var2[2]._M_next;
  p_Var6 = p_Var5[2]._M_next;
  p_Var8 = p_Var1;
  do {
    p_Var9 = p_Var8;
    p_Var8 = p_Var9[2]._M_next;
    p_Var7 = p_Var2;
  } while (p_Var8 != p_Var1);
  do {
    p_Var8 = p_Var7;
    p_Var7 = p_Var8[2]._M_next;
  } while (p_Var7 != p_Var2);
  p_Var1[2]._M_prev[0xf]._M_prev = p_Var5;
  p_Var2[2]._M_prev[0xf]._M_prev = p_Var3;
  p_Var1[3]._M_prev[0xb]._M_prev = p_Var1;
  p_Var2[3]._M_prev[0xb]._M_prev = p_Var2;
  p_Var1[2]._M_prev = p_Var6[2]._M_prev;
  p_Var2[2]._M_prev = p_Var4[2]._M_prev;
  p_Var1[2]._M_next = p_Var4;
  p_Var9[2]._M_next = p_Var5;
  p_Var5[2]._M_next = p_Var1;
  p_Var2[2]._M_next = p_Var6;
  p_Var8[2]._M_next = p_Var3;
  p_Var3[2]._M_next = p_Var2;
  p_Var3[3]._M_prev = p_Var2[3]._M_prev;
  p_Var5[3]._M_prev = p_Var1[3]._M_prev;
  return (EdgeIter)e0._M_node;
}

Assistant:

EdgeIter HalfedgeMesh::flipEdge(EdgeIter e0) {
	// TODO: (meshEdit)
	// This method should flip the given edge and return an iterator to the
	// flipped edge.

	HalfedgeIter h1 = e0->halfedge();
	HalfedgeIter h2 = h1->twin();
	HalfedgeIter h1_next = h1->next();
	HalfedgeIter h1_next_next = h1->next()->next();
	HalfedgeIter h2_next = h2->next();
	HalfedgeIter h2_next_next = h2->next()->next();
	HalfedgeIter h1_prev = prev_Halfedge(h1);
	HalfedgeIter h2_prev = prev_Halfedge(h2);

	h1->vertex()->halfedge() = h2_next;
	h2->vertex()->halfedge() = h1_next;
	h1->face()->halfedge() = h1;
	h2->face()->halfedge() = h2;

	h1->vertex() = h2_next_next->vertex();
	h2->vertex() = h1_next_next->vertex();

	h1->next() = h1_next_next;
	h1_prev->next() = h2_next;
	h2_next->next() = h1;
	h2->next() = h2_next_next;
	h2_prev->next() = h1_next;
	h1_next->next() = h2;

	h1_next->face() = h2->face();
	h2_next->face() = h1->face();

	//showError("flipEdge() not implemented.");
	return e0;
}